

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O3

string * __thiscall
sqlcheck::RiskLevelToString_abi_cxx11_
          (string *__return_storage_ptr__,sqlcheck *this,RiskLevel *risk_level)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "ALL ANTI-PATTERNS";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "HINTS";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "LOW RISK";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "MEDIUM RISK";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "HIGH RISK";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "INVALID";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RiskLevelToString(const RiskLevel& risk_level){

  switch (risk_level) {
    case RISK_LEVEL_HIGH:
      return "HIGH RISK";
    case RISK_LEVEL_MEDIUM:
      return "MEDIUM RISK";
    case RISK_LEVEL_LOW:
      return "LOW RISK";
    case RISK_LEVEL_NONE:
      return "HINTS";
    case RISK_LEVEL_ALL:
      return "ALL ANTI-PATTERNS";

    case RISK_LEVEL_INVALID:
    default:
      return "INVALID";
  }

}